

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t FSE_decompress_wksp_body_bmi2
                 (void *dst,size_t dstCapacity,void *cSrc,size_t cSrcSize,uint maxLog,
                 void *workSpace,size_t wkspSize)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  FSE_DTable *dt;
  long lVar4;
  size_t sVar5;
  long in_RCX;
  long in_RDX;
  ulong uVar6;
  long in_RSI;
  byte *in_RDI;
  uint in_R8D;
  long in_R9;
  ulong in_stack_00000008;
  U32 fastMode;
  FSE_DTableHeader *DTableH;
  void *ptr;
  size_t _var_err__;
  size_t NCountLength;
  FSE_DecompressWksp *wksp;
  uint maxSymbolValue;
  uint tableLog;
  BYTE *ip;
  BYTE *istart;
  size_t _var_err___1;
  FSE_DState_t state2;
  FSE_DState_t state1;
  BIT_DStream_t bitD;
  BYTE *olimit;
  BYTE *omax;
  BYTE *op;
  BYTE *ostart;
  size_t _var_err___2;
  FSE_DState_t state2_1;
  FSE_DState_t state1_1;
  BIT_DStream_t bitD_1;
  BYTE *olimit_1;
  BYTE *omax_1;
  BYTE *op_1;
  BYTE *ostart_1;
  BIT_DStream_status result_5;
  U32 nbBytes_5;
  BIT_DStream_status result_4;
  U32 nbBytes_4;
  BIT_DStream_status result_3;
  U32 nbBytes_3;
  BIT_DStream_status result_2;
  U32 nbBytes_2;
  BIT_DStream_status result_1;
  U32 nbBytes_1;
  BIT_DStream_status result;
  U32 nbBytes;
  undefined4 in_stack_fffffffffffffd18;
  uint in_stack_fffffffffffffd1c;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  uint in_stack_fffffffffffffd28;
  uint in_stack_fffffffffffffd2c;
  uint in_stack_fffffffffffffd30;
  uint in_stack_fffffffffffffd34;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  uint local_23c;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffdf0;
  byte *local_1e8;
  FSE_DState_t local_1d8;
  FSE_DState_t local_1c8;
  BIT_DStream_t local_1b8;
  byte *local_190;
  byte *local_188;
  byte *local_180;
  byte *local_178;
  int local_16c;
  long local_168;
  FSE_DTable *local_160;
  byte *local_158;
  byte *local_140;
  byte *local_138;
  FSE_DState_t local_130;
  FSE_DState_t local_120;
  BIT_DStream_t local_110;
  byte *local_e8;
  byte *local_e0;
  byte *local_d8;
  byte *local_d0;
  int local_c4;
  long local_c0;
  FSE_DTable *local_b8;
  byte *local_b0;
  byte *local_98;
  BIT_DStream_status local_90;
  uint local_8c;
  BIT_DStream_t *local_88;
  BIT_DStream_status local_7c;
  BIT_DStream_status local_78;
  uint local_74;
  BIT_DStream_t *local_70;
  BIT_DStream_status local_64;
  BIT_DStream_status local_60;
  uint local_5c;
  BIT_DStream_t *local_58;
  BIT_DStream_status local_4c;
  BIT_DStream_status local_48;
  uint local_44;
  BIT_DStream_t *local_40;
  BIT_DStream_status local_34;
  BIT_DStream_status local_30;
  uint local_2c;
  BIT_DStream_t *local_28;
  BIT_DStream_status local_1c;
  BIT_DStream_status local_18;
  uint local_14;
  BIT_DStream_t *local_10;
  BIT_DStream_status local_4;
  
  uVar7 = 1;
  if (in_stack_00000008 < 0x204) {
    local_1e8 = (byte *)0xffffffffffffffff;
  }
  else {
    lVar4 = in_R9;
    local_1e8 = (byte *)FSE_readNCount_bmi2((short *)CONCAT44(in_stack_fffffffffffffd3c,
                                                              in_stack_fffffffffffffd38),
                                            (uint *)CONCAT44(in_stack_fffffffffffffd34,
                                                             in_stack_fffffffffffffd30),
                                            (uint *)CONCAT44(in_stack_fffffffffffffd2c,
                                                             in_stack_fffffffffffffd28),
                                            (void *)CONCAT44(in_stack_fffffffffffffd24,
                                                             in_stack_fffffffffffffd20),
                                            CONCAT44(in_stack_fffffffffffffd1c,
                                                     in_stack_fffffffffffffd18),0);
    uVar2 = ERR_isError((size_t)local_1e8);
    if (uVar2 == 0) {
      if (in_R8D < local_23c) {
        local_1e8 = (byte *)0xffffffffffffffd4;
      }
      else {
        pbVar3 = local_1e8 + in_RDX;
        dt = (FSE_DTable *)(in_RCX - (long)local_1e8);
        bVar1 = (byte)local_23c;
        if (in_stack_00000008 <
            ((long)((1 << (bVar1 & 0x1f)) + 2) + ((1L << (bVar1 & 0x3f)) + 0x20bU >> 2) + 0x81) * 4)
        {
          local_1e8 = (byte *)0xffffffffffffffd4;
        }
        else {
          lVar4 = lVar4 + 0x204 + (long)((1 << (bVar1 & 0x1f)) + 1) * 4;
          local_1e8 = (byte *)FSE_buildDTable_internal
                                        (dt,(short *)CONCAT44(in_R8D,in_stack_fffffffffffffdf0),
                                         (uint)((ulong)lVar4 >> 0x20),(uint)lVar4,
                                         (void *)(in_stack_00000008 -
                                                 ((long)((1 << (bVar1 & 0x1f)) + 1) * 4 + 0x204)),
                                         CONCAT44(uVar7,in_stack_fffffffffffffdd8));
          uVar2 = ERR_isError((size_t)local_1e8);
          if (uVar2 == 0) {
            if (*(short *)(in_R9 + 0x202) == 0) {
              local_c0 = in_R9 + 0x200;
              local_c4 = 0;
              local_e0 = in_RDI + in_RSI;
              local_e8 = local_e0 + -3;
              local_d8 = in_RDI;
              local_d0 = in_RDI;
              local_b8 = dt;
              local_b0 = pbVar3;
              local_138 = (byte *)BIT_initDStream((BIT_DStream_t *)
                                                  CONCAT44(in_stack_fffffffffffffd3c,
                                                           in_stack_fffffffffffffd38),
                                                  (void *)CONCAT44(in_stack_fffffffffffffd34,
                                                                   in_stack_fffffffffffffd30),
                                                  CONCAT44(in_stack_fffffffffffffd2c,
                                                           in_stack_fffffffffffffd28));
              uVar2 = ERR_isError((size_t)local_138);
              if (uVar2 == 0) {
                FSE_initDState((FSE_DState_t *)
                               CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                               (BIT_DStream_t *)
                               CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                               (FSE_DTable *)
                               CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
                FSE_initDState((FSE_DState_t *)
                               CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                               (BIT_DStream_t *)
                               CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                               (FSE_DTable *)
                               CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
                while( true ) {
                  local_58 = &local_110;
                  if (local_110.bitsConsumed < 0x41) {
                    if (local_110.ptr < local_110.limitPtr) {
                      if (local_110.ptr == local_110.start) {
                        if (local_110.bitsConsumed < 0x40) {
                          local_4c = BIT_DStream_endOfBuffer;
                        }
                        else {
                          local_4c = BIT_DStream_completed;
                        }
                      }
                      else {
                        local_5c = local_110.bitsConsumed >> 3;
                        uVar6 = (ulong)local_5c;
                        if (local_110.ptr + -uVar6 < local_110.start) {
                          local_5c = (int)local_110.ptr - (int)local_110.start;
                        }
                        local_60 = (BIT_DStream_status)(local_110.ptr + -uVar6 < local_110.start);
                        local_110.ptr = local_110.ptr + -(ulong)local_5c;
                        local_110.bitsConsumed = local_110.bitsConsumed + local_5c * -8;
                        sVar5 = MEM_readLEST((void *)CONCAT44(in_stack_fffffffffffffd1c,
                                                              in_stack_fffffffffffffd18));
                        local_58->bitContainer = sVar5;
                        local_4c = local_60;
                      }
                    }
                    else {
                      local_4c = BIT_reloadDStreamFast
                                           ((BIT_DStream_t *)
                                            CONCAT44(in_stack_fffffffffffffd1c,
                                                     in_stack_fffffffffffffd18));
                    }
                  }
                  else {
                    local_4c = BIT_DStream_overflow;
                  }
                  if (local_4c != BIT_DStream_unfinished || local_e8 <= local_d8) break;
                  if (local_c4 == 0) {
                    bVar1 = FSE_decodeSymbol(&local_120,&local_110);
                  }
                  else {
                    bVar1 = FSE_decodeSymbolFast
                                      ((FSE_DState_t *)
                                       CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30)
                                       ,(BIT_DStream_t *)
                                        CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28
                                                ));
                  }
                  in_stack_fffffffffffffd34 = (uint)bVar1;
                  *local_d8 = bVar1;
                  if (local_c4 == 0) {
                    bVar1 = FSE_decodeSymbol(&local_130,&local_110);
                  }
                  else {
                    bVar1 = FSE_decodeSymbolFast
                                      ((FSE_DState_t *)
                                       (ulong)CONCAT14(bVar1,in_stack_fffffffffffffd30),
                                       (BIT_DStream_t *)
                                       CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28)
                                      );
                  }
                  in_stack_fffffffffffffd30 = (uint)bVar1;
                  local_d8[1] = bVar1;
                  if (local_c4 == 0) {
                    bVar1 = FSE_decodeSymbol(&local_120,&local_110);
                  }
                  else {
                    bVar1 = FSE_decodeSymbolFast
                                      ((FSE_DState_t *)
                                       CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30)
                                       ,(BIT_DStream_t *)
                                        CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28
                                                ));
                  }
                  in_stack_fffffffffffffd2c = (uint)bVar1;
                  local_d8[2] = bVar1;
                  if (local_c4 == 0) {
                    bVar1 = FSE_decodeSymbol(&local_130,&local_110);
                  }
                  else {
                    bVar1 = FSE_decodeSymbolFast
                                      ((FSE_DState_t *)
                                       CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30)
                                       ,(BIT_DStream_t *)
                                        (ulong)CONCAT14(bVar1,in_stack_fffffffffffffd28));
                  }
                  in_stack_fffffffffffffd28 = (uint)bVar1;
                  local_d8[3] = bVar1;
                  local_d8 = local_d8 + 4;
                }
                do {
                  if (local_e0 + -2 < local_d8) {
                    local_98 = (byte *)0xffffffffffffffba;
                    goto LAB_001d8a9a;
                  }
                  if (local_c4 == 0) {
                    bVar1 = FSE_decodeSymbol(&local_120,&local_110);
                  }
                  else {
                    bVar1 = FSE_decodeSymbolFast
                                      ((FSE_DState_t *)
                                       CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30)
                                       ,(BIT_DStream_t *)
                                        CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28
                                                ));
                  }
                  pbVar3 = local_d8 + 1;
                  *local_d8 = bVar1;
                  local_70 = &local_110;
                  local_d8 = pbVar3;
                  if (local_110.bitsConsumed < 0x41) {
                    if (local_110.ptr < local_110.limitPtr) {
                      if (local_110.ptr == local_110.start) {
                        if (local_110.bitsConsumed < 0x40) {
                          local_64 = BIT_DStream_endOfBuffer;
                        }
                        else {
                          local_64 = BIT_DStream_completed;
                        }
                      }
                      else {
                        local_74 = local_110.bitsConsumed >> 3;
                        uVar6 = (ulong)local_74;
                        if (local_110.ptr + -uVar6 < local_110.start) {
                          local_74 = (int)local_110.ptr - (int)local_110.start;
                        }
                        local_78 = (BIT_DStream_status)(local_110.ptr + -uVar6 < local_110.start);
                        local_110.ptr = local_110.ptr + -(ulong)local_74;
                        local_110.bitsConsumed = local_110.bitsConsumed + local_74 * -8;
                        sVar5 = MEM_readLEST((void *)CONCAT44(in_stack_fffffffffffffd1c,
                                                              in_stack_fffffffffffffd18));
                        local_70->bitContainer = sVar5;
                        local_64 = local_78;
                      }
                    }
                    else {
                      local_64 = BIT_reloadDStreamFast
                                           ((BIT_DStream_t *)
                                            CONCAT44(in_stack_fffffffffffffd1c,
                                                     in_stack_fffffffffffffd18));
                    }
                  }
                  else {
                    local_64 = BIT_DStream_overflow;
                  }
                  if (local_64 == BIT_DStream_overflow) {
                    if (local_c4 == 0) {
                      bVar1 = FSE_decodeSymbol(&local_130,&local_110);
                    }
                    else {
                      bVar1 = FSE_decodeSymbolFast
                                        ((FSE_DState_t *)
                                         CONCAT44(in_stack_fffffffffffffd34,
                                                  in_stack_fffffffffffffd30),
                                         (BIT_DStream_t *)
                                         CONCAT44(in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28));
                    }
                    *local_d8 = bVar1;
                    goto LAB_001d8a7f;
                  }
                  if (local_e0 + -2 < local_d8) {
                    local_98 = (byte *)0xffffffffffffffba;
                    goto LAB_001d8a9a;
                  }
                  if (local_c4 == 0) {
                    bVar1 = FSE_decodeSymbol(&local_130,&local_110);
                  }
                  else {
                    bVar1 = FSE_decodeSymbolFast
                                      ((FSE_DState_t *)
                                       CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30)
                                       ,(BIT_DStream_t *)
                                        CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28
                                                ));
                  }
                  in_stack_fffffffffffffd1c = (uint)bVar1;
                  pbVar3 = local_d8 + 1;
                  *local_d8 = bVar1;
                  local_88 = &local_110;
                  local_d8 = pbVar3;
                  if (local_110.bitsConsumed < 0x41) {
                    if (local_110.ptr < local_110.limitPtr) {
                      if (local_110.ptr == local_110.start) {
                        if (local_110.bitsConsumed < 0x40) {
                          local_7c = BIT_DStream_endOfBuffer;
                        }
                        else {
                          local_7c = BIT_DStream_completed;
                        }
                      }
                      else {
                        local_8c = local_110.bitsConsumed >> 3;
                        uVar6 = (ulong)local_8c;
                        if (local_110.ptr + -uVar6 < local_110.start) {
                          local_8c = (int)local_110.ptr - (int)local_110.start;
                        }
                        local_90 = (BIT_DStream_status)(local_110.ptr + -uVar6 < local_110.start);
                        local_110.ptr = local_110.ptr + -(ulong)local_8c;
                        local_110.bitsConsumed = local_110.bitsConsumed + local_8c * -8;
                        sVar5 = MEM_readLEST((void *)(ulong)CONCAT14(bVar1,in_stack_fffffffffffffd18
                                                                    ));
                        local_88->bitContainer = sVar5;
                        local_7c = local_90;
                      }
                    }
                    else {
                      local_7c = BIT_reloadDStreamFast
                                           ((BIT_DStream_t *)
                                            (ulong)CONCAT14(bVar1,in_stack_fffffffffffffd18));
                    }
                  }
                  else {
                    local_7c = BIT_DStream_overflow;
                  }
                } while (local_7c != BIT_DStream_overflow);
                if (local_c4 == 0) {
                  bVar1 = FSE_decodeSymbol(&local_120,&local_110);
                }
                else {
                  bVar1 = FSE_decodeSymbolFast
                                    ((FSE_DState_t *)
                                     CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                     (BIT_DStream_t *)
                                     CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
                }
                *local_d8 = bVar1;
LAB_001d8a7f:
                local_98 = local_d8 + (1 - (long)local_d0);
              }
              else {
                local_98 = local_138;
              }
LAB_001d8a9a:
              local_1e8 = local_98;
            }
            else {
              local_168 = in_R9 + 0x200;
              local_16c = 1;
              local_188 = in_RDI + in_RSI;
              local_190 = local_188 + -3;
              local_180 = in_RDI;
              local_178 = in_RDI;
              local_160 = dt;
              local_158 = pbVar3;
              pbVar3 = (byte *)BIT_initDStream((BIT_DStream_t *)
                                               CONCAT44(in_stack_fffffffffffffd3c,
                                                        in_stack_fffffffffffffd38),
                                               (void *)CONCAT44(in_stack_fffffffffffffd34,
                                                                in_stack_fffffffffffffd30),
                                               CONCAT44(in_stack_fffffffffffffd2c,
                                                        in_stack_fffffffffffffd28));
              uVar2 = ERR_isError((size_t)pbVar3);
              local_140 = pbVar3;
              if (uVar2 == 0) {
                FSE_initDState((FSE_DState_t *)
                               CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                               (BIT_DStream_t *)
                               CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                               (FSE_DTable *)
                               CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
                FSE_initDState((FSE_DState_t *)
                               CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                               (BIT_DStream_t *)
                               CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                               (FSE_DTable *)
                               CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
                while( true ) {
                  local_10 = &local_1b8;
                  if (local_1b8.bitsConsumed < 0x41) {
                    if (local_1b8.ptr < local_1b8.limitPtr) {
                      if (local_1b8.ptr == local_1b8.start) {
                        if (local_1b8.bitsConsumed < 0x40) {
                          local_4 = BIT_DStream_endOfBuffer;
                        }
                        else {
                          local_4 = BIT_DStream_completed;
                        }
                      }
                      else {
                        local_14 = local_1b8.bitsConsumed >> 3;
                        uVar6 = (ulong)local_14;
                        if (local_1b8.ptr + -uVar6 < local_1b8.start) {
                          local_14 = (int)local_1b8.ptr - (int)local_1b8.start;
                        }
                        local_18 = (BIT_DStream_status)(local_1b8.ptr + -uVar6 < local_1b8.start);
                        local_1b8.ptr = local_1b8.ptr + -(ulong)local_14;
                        local_1b8.bitsConsumed = local_1b8.bitsConsumed + local_14 * -8;
                        sVar5 = MEM_readLEST((void *)CONCAT44(in_stack_fffffffffffffd1c,
                                                              in_stack_fffffffffffffd18));
                        local_10->bitContainer = sVar5;
                        local_4 = local_18;
                      }
                    }
                    else {
                      local_4 = BIT_reloadDStreamFast
                                          ((BIT_DStream_t *)
                                           CONCAT44(in_stack_fffffffffffffd1c,
                                                    in_stack_fffffffffffffd18));
                    }
                  }
                  else {
                    local_4 = BIT_DStream_overflow;
                  }
                  if (local_4 != BIT_DStream_unfinished || local_190 <= local_180) break;
                  if (local_16c == 0) {
                    bVar1 = FSE_decodeSymbol(&local_1c8,&local_1b8);
                  }
                  else {
                    bVar1 = FSE_decodeSymbolFast
                                      ((FSE_DState_t *)
                                       CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30)
                                       ,(BIT_DStream_t *)
                                        CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28
                                                ));
                  }
                  *local_180 = bVar1;
                  if (local_16c == 0) {
                    bVar1 = FSE_decodeSymbol(&local_1d8,&local_1b8);
                  }
                  else {
                    bVar1 = FSE_decodeSymbolFast
                                      ((FSE_DState_t *)
                                       CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30)
                                       ,(BIT_DStream_t *)
                                        CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28
                                                ));
                  }
                  local_180[1] = bVar1;
                  if (local_16c == 0) {
                    bVar1 = FSE_decodeSymbol(&local_1c8,&local_1b8);
                  }
                  else {
                    bVar1 = FSE_decodeSymbolFast
                                      ((FSE_DState_t *)
                                       CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30)
                                       ,(BIT_DStream_t *)
                                        CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28
                                                ));
                  }
                  local_180[2] = bVar1;
                  if (local_16c == 0) {
                    bVar1 = FSE_decodeSymbol(&local_1d8,&local_1b8);
                  }
                  else {
                    bVar1 = FSE_decodeSymbolFast
                                      ((FSE_DState_t *)
                                       CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30)
                                       ,(BIT_DStream_t *)
                                        CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28
                                                ));
                  }
                  local_180[3] = bVar1;
                  local_180 = local_180 + 4;
                }
                do {
                  if (local_188 + -2 < local_180) {
                    local_140 = (byte *)0xffffffffffffffba;
                    goto LAB_001d80e5;
                  }
                  if (local_16c == 0) {
                    bVar1 = FSE_decodeSymbol(&local_1c8,&local_1b8);
                  }
                  else {
                    bVar1 = FSE_decodeSymbolFast
                                      ((FSE_DState_t *)
                                       CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30)
                                       ,(BIT_DStream_t *)
                                        CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28
                                                ));
                  }
                  pbVar3 = local_180 + 1;
                  *local_180 = bVar1;
                  local_28 = &local_1b8;
                  local_180 = pbVar3;
                  if (local_1b8.bitsConsumed < 0x41) {
                    if (local_1b8.ptr < local_1b8.limitPtr) {
                      if (local_1b8.ptr == local_1b8.start) {
                        if (local_1b8.bitsConsumed < 0x40) {
                          local_1c = BIT_DStream_endOfBuffer;
                        }
                        else {
                          local_1c = BIT_DStream_completed;
                        }
                      }
                      else {
                        local_2c = local_1b8.bitsConsumed >> 3;
                        uVar6 = (ulong)local_2c;
                        if (local_1b8.ptr + -uVar6 < local_1b8.start) {
                          local_2c = (int)local_1b8.ptr - (int)local_1b8.start;
                        }
                        local_30 = (BIT_DStream_status)(local_1b8.ptr + -uVar6 < local_1b8.start);
                        local_1b8.ptr = local_1b8.ptr + -(ulong)local_2c;
                        local_1b8.bitsConsumed = local_1b8.bitsConsumed + local_2c * -8;
                        sVar5 = MEM_readLEST((void *)CONCAT44(in_stack_fffffffffffffd1c,
                                                              in_stack_fffffffffffffd18));
                        local_28->bitContainer = sVar5;
                        local_1c = local_30;
                      }
                    }
                    else {
                      local_1c = BIT_reloadDStreamFast
                                           ((BIT_DStream_t *)
                                            CONCAT44(in_stack_fffffffffffffd1c,
                                                     in_stack_fffffffffffffd18));
                    }
                  }
                  else {
                    local_1c = BIT_DStream_overflow;
                  }
                  if (local_1c == BIT_DStream_overflow) {
                    if (local_16c == 0) {
                      bVar1 = FSE_decodeSymbol(&local_1d8,&local_1b8);
                    }
                    else {
                      bVar1 = FSE_decodeSymbolFast
                                        ((FSE_DState_t *)
                                         CONCAT44(in_stack_fffffffffffffd34,
                                                  in_stack_fffffffffffffd30),
                                         (BIT_DStream_t *)
                                         CONCAT44(in_stack_fffffffffffffd2c,
                                                  in_stack_fffffffffffffd28));
                    }
                    *local_180 = bVar1;
                    goto LAB_001d80ca;
                  }
                  if (local_188 + -2 < local_180) {
                    local_140 = (byte *)0xffffffffffffffba;
                    goto LAB_001d80e5;
                  }
                  if (local_16c == 0) {
                    bVar1 = FSE_decodeSymbol(&local_1d8,&local_1b8);
                  }
                  else {
                    bVar1 = FSE_decodeSymbolFast
                                      ((FSE_DState_t *)
                                       CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30)
                                       ,(BIT_DStream_t *)
                                        CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28
                                                ));
                  }
                  pbVar3 = local_180 + 1;
                  *local_180 = bVar1;
                  local_40 = &local_1b8;
                  local_180 = pbVar3;
                  if (local_1b8.bitsConsumed < 0x41) {
                    if (local_1b8.ptr < local_1b8.limitPtr) {
                      if (local_1b8.ptr == local_1b8.start) {
                        if (local_1b8.bitsConsumed < 0x40) {
                          local_34 = BIT_DStream_endOfBuffer;
                        }
                        else {
                          local_34 = BIT_DStream_completed;
                        }
                      }
                      else {
                        local_44 = local_1b8.bitsConsumed >> 3;
                        uVar6 = (ulong)local_44;
                        if (local_1b8.ptr + -uVar6 < local_1b8.start) {
                          local_44 = (int)local_1b8.ptr - (int)local_1b8.start;
                        }
                        local_48 = (BIT_DStream_status)(local_1b8.ptr + -uVar6 < local_1b8.start);
                        local_1b8.ptr = local_1b8.ptr + -(ulong)local_44;
                        local_1b8.bitsConsumed = local_1b8.bitsConsumed + local_44 * -8;
                        sVar5 = MEM_readLEST((void *)CONCAT44(in_stack_fffffffffffffd1c,
                                                              in_stack_fffffffffffffd18));
                        local_40->bitContainer = sVar5;
                        local_34 = local_48;
                      }
                    }
                    else {
                      local_34 = BIT_reloadDStreamFast
                                           ((BIT_DStream_t *)
                                            CONCAT44(in_stack_fffffffffffffd1c,
                                                     in_stack_fffffffffffffd18));
                    }
                  }
                  else {
                    local_34 = BIT_DStream_overflow;
                  }
                } while (local_34 != BIT_DStream_overflow);
                if (local_16c == 0) {
                  bVar1 = FSE_decodeSymbol(&local_1c8,&local_1b8);
                }
                else {
                  bVar1 = FSE_decodeSymbolFast
                                    ((FSE_DState_t *)
                                     CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                     (BIT_DStream_t *)
                                     CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
                }
                *local_180 = bVar1;
LAB_001d80ca:
                local_140 = local_180 + (1 - (long)local_178);
              }
LAB_001d80e5:
              local_1e8 = local_140;
            }
          }
        }
      }
    }
  }
  return (size_t)local_1e8;
}

Assistant:

BMI2_TARGET_ATTRIBUTE static size_t FSE_decompress_wksp_body_bmi2(void* dst, size_t dstCapacity, const void* cSrc, size_t cSrcSize, unsigned maxLog, void* workSpace, size_t wkspSize)
{
    return FSE_decompress_wksp_body(dst, dstCapacity, cSrc, cSrcSize, maxLog, workSpace, wkspSize, 1);
}